

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O1

bool withinB44ErrorBounds(uint16_t (*A) [4],uint16_t (*B) [4])

{
  int iVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  int i_1;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ostream *poVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  int i;
  uint uVar18;
  long lVar19;
  ushort uVar20;
  int iVar21;
  int iVar22;
  bool bVar23;
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [16];
  short sVar29;
  short sVar34;
  short sVar35;
  short sVar37;
  undefined4 uVar36;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  uint16_t A1 [16];
  int d [16];
  uint16_t t [16];
  ushort local_138 [22];
  undefined4 local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8 [16];
  int local_b8 [16];
  uint16_t (*local_78) [4];
  uint16_t (*local_70) [4];
  ulong local_68;
  ulong local_60;
  ulong local_58 [5];
  undefined1 auVar27 [16];
  ushort uVar28;
  undefined1 auVar32 [16];
  
  i_1._0_1_ = true;
  lVar19 = 0;
  do {
    if (A[lVar19] != B[lVar19]) {
      i_1._0_1_ = false;
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
  bVar23 = true;
  if (!i_1._0_1_) {
    uVar12 = 0;
    do {
      uVar28 = A[uVar12 >> 2 & 0x3fffffff][(uint)uVar12 & 3];
      if ((~uVar28 & 0x7c00) == 0) {
        *(undefined2 *)((long)local_58 + uVar12 * 2) = 0x8000;
      }
      else {
        if ((short)uVar28 < 0) {
          uVar28 = ~uVar28;
        }
        else {
          uVar28 = uVar28 | 0x8000;
        }
        *(ushort *)((long)local_58 + uVar12 * 2) = uVar28;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 0x10);
    lVar19 = 0;
    auVar31 = (undefined1  [16])0x0;
    do {
      auVar26 = psubusw(*(undefined1 (*) [16])((long)local_58 + lVar19 * 2),auVar31);
      auVar24._0_2_ = auVar26._0_2_ + auVar31._0_2_;
      auVar24._2_2_ = auVar26._2_2_ + auVar31._2_2_;
      auVar24._4_2_ = auVar26._4_2_ + auVar31._4_2_;
      auVar24._6_2_ = auVar26._6_2_ + auVar31._6_2_;
      auVar24._8_2_ = auVar26._8_2_ + auVar31._8_2_;
      auVar24._10_2_ = auVar26._10_2_ + auVar31._10_2_;
      auVar27._12_2_ = auVar26._12_2_ + auVar31._12_2_;
      auVar27._0_12_ = auVar24;
      auVar27._14_2_ = auVar26._14_2_ + auVar31._14_2_;
      lVar19 = lVar19 + 8;
      auVar31 = auVar27;
    } while (lVar19 != 0x10);
    auVar30._4_4_ = auVar27._12_4_;
    auVar30._0_4_ = auVar24._8_4_;
    auVar30._8_4_ = auVar24._8_4_;
    auVar30._12_4_ = auVar27._12_4_;
    auVar31 = psubusw(auVar30,auVar27);
    sVar29 = auVar31._0_2_ + auVar24._0_2_;
    sVar34 = auVar31._2_2_ + auVar24._2_2_;
    sVar35 = auVar31._4_2_ + auVar24._4_2_;
    sVar37 = auVar31._6_2_ + auVar24._6_2_;
    auVar32._0_8_ = CONCAT26(sVar37,CONCAT24(sVar35,CONCAT22(sVar34,sVar29)));
    auVar32._8_2_ = auVar31._8_2_ + auVar24._8_2_;
    auVar32._10_2_ = auVar31._10_2_ + auVar24._10_2_;
    auVar32._12_2_ = auVar31._12_2_ + auVar27._12_2_;
    auVar32._14_2_ = auVar31._14_2_ + auVar27._14_2_;
    uVar36 = (undefined4)((ulong)auVar32._0_8_ >> 0x20);
    auVar31._4_4_ = uVar36;
    auVar31._0_4_ = uVar36;
    auVar31._8_4_ = uVar36;
    auVar31._12_4_ = uVar36;
    auVar31 = psubusw(auVar31,auVar32);
    sVar29 = auVar31._0_2_ + sVar29;
    uVar28 = auVar31._2_2_ + sVar34;
    auVar25._0_8_ =
         CONCAT26(auVar31._6_2_ + sVar37,CONCAT24(auVar31._4_2_ + sVar35,CONCAT22(uVar28,sVar29)));
    auVar25._8_2_ = auVar31._8_2_ + auVar32._8_2_;
    auVar25._10_2_ = auVar31._10_2_ + auVar32._10_2_;
    auVar26._12_2_ = auVar31._12_2_ + auVar32._12_2_;
    auVar26._0_12_ = auVar25;
    auVar26._14_2_ = auVar31._14_2_ + auVar32._14_2_;
    auVar33._2_2_ = 0;
    auVar33._0_2_ = uVar28;
    auVar33._4_4_ = (uint)((ulong)auVar25._0_8_ >> 0x30);
    auVar33._8_4_ = auVar25._8_4_ >> 0x10;
    auVar33._12_4_ = auVar26._12_4_ >> 0x10;
    auVar31 = psubusw(auVar33,auVar26);
    local_58[0]._0_2_ = auVar31._0_2_ + sVar29;
    local_10c = CONCAT22(auVar31._2_2_ + uVar28,(ushort)local_58[0]);
    uVar17 = (uint)(ushort)local_58[0];
    iVar16 = -1;
    local_78 = A;
    local_70 = B;
    do {
      iVar1 = iVar16 + 1;
      bVar15 = (byte)iVar1;
      uVar11 = iVar16 + 2;
      uVar18 = ~(-1 << (bVar15 & 0x1f));
      lVar19 = 0;
      do {
        uVar12 = *(ulong *)((long)local_58 + lVar19 * 2);
        auVar7._8_4_ = 0;
        auVar7._0_8_ = uVar12;
        auVar7._12_2_ = (short)(uVar12 >> 0x30);
        auVar8._8_2_ = (short)(uVar12 >> 0x20);
        auVar8._0_8_ = uVar12;
        auVar8._10_4_ = auVar7._10_4_;
        auVar10._6_8_ = 0;
        auVar10._0_6_ = auVar8._8_6_;
        auVar9._4_2_ = (short)(uVar12 >> 0x10);
        auVar9._0_4_ = (uint)uVar12;
        auVar9._6_8_ = SUB148(auVar10 << 0x40,6);
        uVar3 = (uVar17 - ((uint)uVar12 & 0xffff)) * 2;
        uVar4 = (uVar17 - auVar9._4_4_) * 2;
        uVar5 = (uVar17 - auVar8._8_4_) * 2;
        uVar6 = (uVar17 - (auVar7._10_4_ >> 0x10)) * 2;
        uVar12 = (ulong)uVar11;
        local_b8[lVar19] = (int)(uVar3 + uVar18 + (uVar3 >> uVar12 & 1)) >> ZEXT416(uVar11);
        local_b8[lVar19 + 1] = (int)(uVar4 + uVar18 + (uVar4 >> uVar12 & 1)) >> ZEXT416(uVar11);
        local_b8[lVar19 + 2] = (int)(uVar5 + uVar18 + (uVar5 >> uVar12 & 1)) >> ZEXT416(uVar11);
        local_b8[lVar19 + 3] = (int)(uVar6 + uVar18 + (uVar6 >> uVar12 & 1)) >> ZEXT416(uVar11);
        lVar19 = lVar19 + 4;
      } while (lVar19 != 0x10);
      local_f8[0] = (local_b8[0] - local_b8[4]) + 0x20;
      uVar11 = local_b8[4] - local_b8[8];
      local_68 = (ulong)uVar11;
      local_f8[1] = uVar11 + 0x20;
      uVar18 = local_b8[8] - local_b8[0xc];
      local_60 = (ulong)uVar18;
      local_f8[2] = uVar18 + 0x20;
      local_108 = local_b8[0];
      local_f8[3] = (local_b8[0] - local_b8[1]) + 0x20;
      local_f8[4] = (local_b8[4] - local_b8[5]) + 0x20;
      local_f8[5] = (local_b8[8] - local_b8[9]) + 0x20;
      local_f8[6] = (local_b8[0xc] - local_b8[0xd]) + 0x20;
      local_fc = (local_b8[1] - local_b8[2]) + 0x20;
      local_f8[7] = local_fc;
      local_f8[8] = (local_b8[5] - local_b8[6]) + 0x20;
      local_104 = (local_b8[9] - local_b8[10]) + 0x20;
      local_f8[9] = local_104;
      local_100 = (local_b8[0xd] - local_b8[0xe]) + 0x20;
      local_f8[10] = local_100;
      local_f8[0xb] = (local_b8[2] - local_b8[3]) + 0x20;
      local_f8[0xc] = (local_b8[6] - local_b8[7]) + 0x20;
      local_f8[0xd] = (local_b8[10] - local_b8[0xb]) + 0x20;
      local_f8[0xe] = (local_b8[0xe] - local_b8[0xf]) + 0x20;
      lVar19 = 1;
      iVar21 = local_f8[0];
      iVar22 = local_f8[0];
      do {
        iVar16 = local_f8[lVar19];
        if (iVar16 <= iVar22) {
          iVar22 = iVar16;
        }
        if (iVar16 < iVar21) {
          iVar16 = iVar21;
        }
        iVar21 = iVar16;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0xf);
      iVar16 = iVar1;
    } while ((iVar22 < 0) || (0x3f < iVar21));
    local_58[0]._0_2_ = (ushort)local_58[0] - (short)(local_b8[0] << (bVar15 & 0x1f));
    local_138[0] = (ushort)local_58[0];
    sVar29 = (short)(-0x20 << (bVar15 & 0x1f));
    local_138[4] = (short)(local_f8[0] << (bVar15 & 0x1f)) + (ushort)local_58[0] + sVar29;
    local_138[1] = (short)(local_f8[3] << (bVar15 & 0x1f)) + (ushort)local_58[0] + sVar29;
    local_138[8] = (short)(uVar11 << (bVar15 & 0x1f)) + local_138[4];
    local_138[0xc] = (short)(uVar18 + uVar11 << (bVar15 & 0x1f)) + local_138[4];
    local_138[5] = (short)(local_f8[4] << (bVar15 & 0x1f)) + sVar29 + local_138[4];
    local_138[9] = (short)(local_f8[5] << (bVar15 & 0x1f)) + sVar29 + local_138[8];
    local_138[0xd] = (short)(local_f8[6] << (bVar15 & 0x1f)) + sVar29 + local_138[0xc];
    local_138[2] = (short)(local_fc << (bVar15 & 0x1f)) + sVar29 + local_138[1];
    local_138[6] = (short)(local_f8[8] << (bVar15 & 0x1f)) + sVar29 + local_138[5];
    local_138[10] = (short)(local_104 << (bVar15 & 0x1f)) + sVar29 + local_138[9];
    local_138[0xe] = (short)(local_100 << (bVar15 & 0x1f)) + sVar29 + local_138[0xd];
    local_138[3] = (short)(local_f8[0xb] << (bVar15 & 0x1f)) + sVar29 + local_138[2];
    local_138[7] = (short)(local_f8[0xc] << (bVar15 & 0x1f)) + sVar29 + local_138[6];
    local_138[0xb] = (short)(local_f8[0xd] << (bVar15 & 0x1f)) + sVar29 + local_138[10];
    local_138[0xf] = (short)(local_f8[0xe] << (bVar15 & 0x1f)) + sVar29 + local_138[0xe];
    uVar12 = 0;
    bVar23 = false;
    do {
      uVar13 = uVar12 >> 2 & 0x3fffffff;
      uVar17 = (uint)uVar12 & 3;
      uVar28 = local_70[uVar13][uVar17];
      uVar20 = uVar28 | 0x8000;
      if ((short)uVar28 < 0) {
        uVar20 = ~uVar28;
      }
      uVar28 = local_138[uVar12];
      if ((uVar28 + 5 < (uint)uVar20) || ((int)(uint)uVar20 < (int)(uVar28 - 5))) {
        uVar2 = local_78[uVar13][uVar17];
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"B44 idx ",8);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(uint)uVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": B bits ",9);
        *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
             *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
        *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
             *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar14," (",2);
        poVar14 = std::ostream::_M_insert<double>
                            ((double)*(float *)(_imath_half_to_float_table + (ulong)uVar20 * 4));
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,") too different from A1 bits ",0x1d);
        *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
             *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
        *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
             *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar14," (",2);
        poVar14 = std::ostream::_M_insert<double>
                            ((double)*(float *)(_imath_half_to_float_table + (ulong)uVar28 * 4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14," orig ",6);
        *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
             *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
        *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) =
             *(uint *)(poVar14 + *(long *)(*(long *)poVar14 + -0x18) + 0x18) & 0xffffffb5 | 2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar14," (",2);
        poVar14 = std::ostream::_M_insert<double>
                            ((double)*(float *)(_imath_half_to_float_table + (ulong)uVar2 * 4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
        std::ostream::put((char)poVar14);
        std::ostream::flush();
        return bVar23;
      }
      bVar23 = 0xe < uVar12;
      uVar12 = uVar12 + 1;
    } while (uVar12 != 0x10);
  }
  return bVar23;
}

Assistant:

inline bool
withinB44ErrorBounds (const uint16_t A[4][4], const uint16_t B[4][4])
{
    //
    // Assuming that a 4x4 pixel block, B, was generated by
    // compressing and uncompressing another pixel block, A,
    // using OpenEXR's B44 compression method, check whether
    // the differences between A and B are what we would
    // expect from the compressor.
    //

    //
    // The block may not have been compressed at all if it
    // was part of a very small tile.
    //

    bool equal = true;

    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            if (A[i][j] != B[i][j]) equal = false;

    if (equal) return true;

    //
    // The block was compressed.
    //
    // Perform a "light" version of the B44 compression on A
    // (see the pack() function in ImfB44Compressor.cpp).
    //

    uint16_t t[16];

    for (int i = 0; i < 16; ++i)
    {
        uint16_t Abits = A[i / 4][i % 4];

        if ((Abits & 0x7c00) == 0x7c00)
            t[i] = 0x8000;
        else if (Abits & 0x8000)
            t[i] = ~Abits;
        else
            t[i] = Abits | 0x8000;
    }

    uint16_t tMax = 0;

    for (int i = 0; i < 16; ++i)
        if (tMax < t[i]) tMax = t[i];

    int shift = -1;
    int d[16];
    int r[15];
    int rMin;
    int rMax;

    do
    {
        shift += 1;

        for (int i = 0; i < 16; ++i)
            d[i] = shiftAndRound (tMax - t[i], shift);

        const int bias = 0x20;

        r[0] = d[0] - d[4] + bias;
        r[1] = d[4] - d[8] + bias;
        r[2] = d[8] - d[12] + bias;

        r[3] = d[0] - d[1] + bias;
        r[4] = d[4] - d[5] + bias;
        r[5] = d[8] - d[9] + bias;
        r[6] = d[12] - d[13] + bias;

        r[7]  = d[1] - d[2] + bias;
        r[8]  = d[5] - d[6] + bias;
        r[9]  = d[9] - d[10] + bias;
        r[10] = d[13] - d[14] + bias;

        r[11] = d[2] - d[3] + bias;
        r[12] = d[6] - d[7] + bias;
        r[13] = d[10] - d[11] + bias;
        r[14] = d[14] - d[15] + bias;

        rMin = r[0];
        rMax = r[0];

        for (int i = 1; i < 15; ++i)
        {
            if (rMin > r[i]) rMin = r[i];

            if (rMax < r[i]) rMax = r[i];
        }
    } while (rMin < 0 || rMax > 0x3f);

    t[0] = tMax - (d[0] << shift);

    //
    // Now perform a "light" version of the decompression method.
    // (see the unpack() function in ImfB44Compressor.cpp).
    //

    uint16_t  A1[16];
    const int bias = 0x20 << shift;

    A1[0]  = t[0];
    A1[4]  = A1[0] + (r[0] << shift) - bias;
    A1[8]  = A1[4] + (r[1] << shift) - bias;
    A1[12] = A1[8] + (r[2] << shift) - bias;

    A1[1]  = A1[0] + (r[3] << shift) - bias;
    A1[5]  = A1[4] + (r[4] << shift) - bias;
    A1[9]  = A1[8] + (r[5] << shift) - bias;
    A1[13] = A1[12] + (r[6] << shift) - bias;

    A1[2]  = A1[1] + (r[7] << shift) - bias;
    A1[6]  = A1[5] + (r[8] << shift) - bias;
    A1[10] = A1[9] + (r[9] << shift) - bias;
    A1[14] = A1[13] + (r[10] << shift) - bias;

    A1[3]  = A1[2] + (r[11] << shift) - bias;
    A1[7]  = A1[6] + (r[12] << shift) - bias;
    A1[11] = A1[10] + (r[13] << shift) - bias;
    A1[15] = A1[14] + (r[14] << shift) - bias;

    //
    // Compare the result with B, allowing for an difference
    // of a couple of units in the last place.
    //

    for (int i = 0; i < 16; ++i)
    {
        uint16_t A1bits = A1[i];
        uint16_t Bbits  = B[i / 4][i % 4];
        uint16_t Abits  = A[i / 4][i % 4];

        if (Bbits & 0x8000)
            Bbits = ~Bbits;
        else
            Bbits = Bbits | 0x8000;

        if (Bbits > A1bits + 5 || Bbits < A1bits - 5)
        {
            std::cerr << "B44 idx " << i << ": B bits " << std::hex << Bbits
                      << std::dec << " (" << imath_half_to_float (Bbits)
                      << ") too different from A1 bits " << std::hex << A1bits
                      << std::dec << " (" << imath_half_to_float (A1bits) << ")"
                      << " orig " << std::hex << Abits << std::dec << " ("
                      << imath_half_to_float (Abits) << ")" << std::endl;
            return false;
        }
    }

    return true;
}